

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void __thiscall deqp::gls::ContextShaderProgram::shadeFragments(ContextShaderProgram *this)

{
  int iVar1;
  GenericVec4 *pGVar2;
  FragmentShadingContext *in_RCX;
  uint in_EDX;
  ulong uVar3;
  long lVar4;
  FragmentPacket *in_RSI;
  int iVar5;
  ulong uVar6;
  deUint32 dStack_28;
  deUint32 dStack_24;
  deUint32 dStack_20;
  deUint32 dStack_1c;
  
  uVar6 = 0;
  rr::readTriangleVarying<float>((rr *)&dStack_28,in_RSI,in_RCX,0,0);
  pGVar2 = in_RCX->outputArray;
  iVar1 = in_RCX->numFragmentOutputs;
  uVar3 = (ulong)in_EDX;
  if ((int)in_EDX < 1) {
    uVar3 = uVar6;
  }
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      iVar5 = ((uint)lVar4 | (int)uVar6 * 4) * iVar1;
      pGVar2[iVar5].v.uData[0] = dStack_28;
      pGVar2[iVar5].v.uData[1] = dStack_24;
      pGVar2[iVar5].v.uData[2] = dStack_20;
      pGVar2[iVar5].v.uData[3] = dStack_1c;
    }
  }
  return;
}

Assistant:

void ContextShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const size_t varyingLocColor = 0;

	// Triangles are flashaded
	tcu::Vec4 color = rr::readTriangleVarying<float>(packets[0], context, varyingLocColor, 0);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
}